

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_time_warping.cc
# Opt level: O0

void __thiscall
sptk::DynamicTimeWarping::DynamicTimeWarping
          (DynamicTimeWarping *this,int num_order,LocalPathConstraints local_path_constraint,
          DistanceMetrics distance_metric)

{
  undefined1 uVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  DistanceMetrics in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  double dVar5;
  int k;
  int num_candidate;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar6;
  int *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *this_01;
  bool local_c5;
  int local_c4;
  
  *in_RDI = &PTR__DynamicTimeWarping_0012ec98;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  DistanceCalculation::DistanceCalculation
            ((DistanceCalculation *)(in_RDI + 2),*(int *)(in_RDI + 1),in_ECX);
  local_c5 = true;
  if (*(int *)((long)in_RDI + 0xc) != 4) {
    local_c5 = *(int *)((long)in_RDI + 0xc) == 6;
  }
  *(bool *)(in_RDI + 5) = local_c5;
  *(undefined1 *)((long)in_RDI + 0x29) = 1;
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 6);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x108c78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x108c8b);
  if ((*(int *)(in_RDI + 1) < 0) ||
     (uVar1 = DistanceCalculation::IsValid((DistanceCalculation *)(in_RDI + 2)), !(bool)uVar1)) {
    *(undefined1 *)((long)in_RDI + 0x29) = 0;
  }
  else {
    this_00 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
              (ulong)*(uint *)((long)in_RDI + 0xc);
    switch(this_00) {
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x2:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x3:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x4:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x5:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x6:
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                (this_00,in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    default:
      *(undefined1 *)((long)in_RDI + 0x29) = 0;
      return;
    }
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       (in_RDI + 6));
    std::vector<double,_std::allocator<double>_>::resize
              (this_01,CONCAT17(uVar1,in_stack_ffffffffffffff08));
    for (local_c4 = 0; local_c4 < (int)sVar2; local_c4 = local_c4 + 1) {
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (in_RDI + 6),(long)local_c4);
      iVar6 = pvVar3->first;
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (in_RDI + 6),(long)local_c4);
      dVar5 = (double)(iVar6 + pvVar3->second);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_c4);
      *pvVar4 = dVar5;
    }
  }
  return;
}

Assistant:

DynamicTimeWarping::DynamicTimeWarping(
    int num_order, LocalPathConstraints local_path_constraint,
    DistanceCalculation::DistanceMetrics distance_metric)
    : num_order_(num_order),
      local_path_constraint_(local_path_constraint),
      distance_calculation_(num_order_, distance_metric),
      includes_skip_transition_((kType4 == local_path_constraint_ ||
                                 kType6 == local_path_constraint_)),
      is_valid_(true) {
  if (num_order_ < 0 || !distance_calculation_.IsValid()) {
    is_valid_ = false;
    return;
  }

  switch (local_path_constraint_) {
    case kType0: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(0, 1);
      break;
    }
    case kType1: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(0, 1);
      local_path_candidates_.emplace_back(1, 1);
      break;
    }
    case kType2: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(1, 1);
      break;
    }
    case kType3: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(1, 1);
      local_path_candidates_.emplace_back(1, 2);
      break;
    }
    case kType4: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(0, 1);
      local_path_candidates_.emplace_back(1, 1);
      break;
    }
    case kType5: {
      local_path_candidates_.emplace_back(1, 1);
      local_path_candidates_.emplace_back(1, 2);
      local_path_candidates_.emplace_back(2, 1);
      break;
    }
    case kType6: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(1, 1);
      local_path_candidates_.emplace_back(1, 2);
      break;
    }
    default: {
      is_valid_ = false;
      return;
    }
  }

  const int num_candidate(static_cast<int>(local_path_candidates_.size()));
  local_path_weights_.resize(num_candidate);
  for (int k(0); k < num_candidate; ++k) {
    local_path_weights_[k] =
        local_path_candidates_[k].first + local_path_candidates_[k].second;
  }
}